

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O3

void __thiscall
ctemplate::TemplateDictionary::ShowSection(TemplateDictionary *this,TemplateString section_name)

{
  UnsafeArena *pUVar1;
  BaseArena *this_00;
  TemplateDictionary *template_global_dict_owner;
  small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
  *this_01;
  int iVar2;
  SectionDict *this_02;
  TemplateDictionary *this_03;
  vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
  *this_04;
  char *pcVar3;
  data_type *ppvVar4;
  TemplateDictionary *local_80;
  TemplateString local_78;
  TemplateString local_58;
  
  this_02 = this->section_dict_;
  if (this_02 == (SectionDict *)0x0) {
    this_02 = (SectionDict *)BaseArena::GetMemory(&this->arena_->super_BaseArena,0x50,8);
    pUVar1 = this->arena_;
    this_02->size_ = 0;
    (this_02->functor_).arena_ = pUVar1;
    this->section_dict_ = this_02;
  }
  local_78.ptr_ = (char *)TemplateString::GetGlobalId(&section_name);
  iVar2 = small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
          ::count(this_02,(key_type *)&local_78);
  if (iVar2 == 0) {
    local_78.ptr_ = "empty dictionary";
    local_78.length_ = 0x10;
    local_78.is_immutable_ = false;
    local_78.id_ = 0;
    this_00 = &this->arena_->super_BaseArena;
    template_global_dict_owner = this->template_global_dict_owner_;
    this_03 = (TemplateDictionary *)BaseArena::GetMemory(this_00,0x70,8);
    TemplateDictionary(this_03,&local_78,(UnsafeArena *)this_00,this,template_global_dict_owner);
    local_80 = this_03;
    this_04 = (vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
               *)BaseArena::GetMemory(&this->arena_->super_BaseArena,0x20,8);
    *(UnsafeArena **)this_04 = this->arena_;
    *(undefined8 *)(this_04 + 0x18) = 0;
    *(undefined8 *)(this_04 + 8) = 0;
    *(undefined8 *)(this_04 + 0x10) = 0;
    std::
    vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
    ::_M_realloc_insert<ctemplate::TemplateDictionary*const&>(this_04,(iterator)0x0,&local_80);
    this_01 = this->section_dict_;
    local_58.is_immutable_ = section_name.is_immutable_;
    local_58._17_7_ = section_name._17_7_;
    local_58.id_ = section_name.id_;
    local_58.ptr_ = section_name.ptr_;
    local_58.length_ = section_name.length_;
    pcVar3 = (char *)TemplateString::GetGlobalId(&local_58);
    local_78.ptr_ = pcVar3;
    ppvVar4 = small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
              ::operator[](this_01,(key_type *)&local_78);
    *ppvVar4 = (data_type)this_04;
    if (local_58.id_ == 0) {
      local_78.ptr_ = local_58.ptr_;
      local_78.length_ = local_58.length_;
      local_78.is_immutable_ = local_58.is_immutable_;
      local_78.id_ = (TemplateId)pcVar3;
      TemplateString::AddToGlobalIdToNameMap(&local_78);
    }
  }
  return;
}

Assistant:

void TemplateDictionary::ShowSection(const TemplateString section_name) {
  LazilyCreateDict(&section_dict_);
  if (!section_dict_->count(section_name.GetGlobalId())) {
    TemplateDictionary* empty_dict = CreateTemplateSubdict(
        "empty dictionary", arena_, this, template_global_dict_owner_);
    DictVector* sub_dict = CreateDictVector();
    sub_dict->push_back(empty_dict);
    HashInsert(section_dict_, section_name, sub_dict);
  }
}